

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::assignCompressedObjectNumbers(QPDFWriter *this,QPDFObjGen og)

{
  _Base_ptr p_Var1;
  int iVar2;
  element_type *peVar3;
  pointer pQVar4;
  long lVar5;
  mapped_type *pmVar6;
  Object *pOVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ulong idx;
  QPDFObjGen *iter;
  pointer pQVar11;
  int objid;
  int local_2c;
  
  local_2c = og.obj;
  if ((ulong)og >> 0x20 == 0) {
    peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = &(peVar3->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var8 = p_Var1;
    for (p_Var10 = *(_Base_ptr *)
                    ((long)&(peVar3->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header +
                    8); p_Var10 != (_Base_ptr)0x0;
        p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < local_2c]) {
      if (local_2c <= (int)p_Var10[1]._M_color) {
        p_Var8 = p_Var10;
      }
    }
    p_Var10 = p_Var1;
    if ((p_Var8 != p_Var1) && (p_Var10 = p_Var8, local_2c < (int)p_Var8[1]._M_color)) {
      p_Var10 = p_Var1;
    }
    if (p_Var10 != p_Var1) {
      pmVar6 = std::
               map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
               ::operator[](&peVar3->object_stream_to_objects,&local_2c);
      pQVar4 = (pmVar6->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pQVar11 = (pmVar6->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
                     super__Vector_impl_data._M_start; pQVar11 != pQVar4; pQVar11 = pQVar11 + 1) {
        peVar3 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar2 = peVar3->next_objid;
        peVar3->next_objid = iVar2 + 1;
        idx = (ulong)pQVar11->obj;
        lVar5 = *(long *)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          ._M_impl;
        uVar9 = ((long)*(pointer *)
                        ((long)&(peVar3->obj).super_ObjTable<QPDFWriter::Object>.
                                super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                .
                                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                        + 8) - lVar5 >> 2) * -0x5555555555555555;
        if (uVar9 < idx || uVar9 - idx == 0) {
          pOVar7 = ObjTable<QPDFWriter::Object>::large_element
                             (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,idx);
        }
        else {
          pOVar7 = (Object *)(lVar5 + idx * 0xc);
        }
        pOVar7->renumber = iVar2;
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::assignCompressedObjectNumbers(QPDFObjGen og)
{
    int objid = og.getObj();
    if ((og.getGen() != 0) || (m->object_stream_to_objects.count(objid) == 0)) {
        // This is not an object stream.
        return;
    }

    // Reserve numbers for the objects that belong to this object stream.
    for (auto const& iter: m->object_stream_to_objects[objid]) {
        m->obj[iter].renumber = m->next_objid++;
    }
}